

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow *window)

{
  ImGuiWindow *window_local;
  
  window->MemoryCompacted = true;
  window->MemoryDrawListIdxCapacity = (window->DrawList->IdxBuffer).Capacity;
  window->MemoryDrawListVtxCapacity = (window->DrawList->VtxBuffer).Capacity;
  ImVector<unsigned_int>::clear(&window->IDStack);
  ImDrawList::_ClearFreeMemory(window->DrawList);
  ImVector<ImGuiWindow_*>::clear(&(window->DC).ChildWindows);
  ImVector<float>::clear(&(window->DC).ItemWidthStack);
  ImVector<float>::clear(&(window->DC).TextWrapPosStack);
  return;
}

Assistant:

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow* window)
{
    window->MemoryCompacted = true;
    window->MemoryDrawListIdxCapacity = window->DrawList->IdxBuffer.Capacity;
    window->MemoryDrawListVtxCapacity = window->DrawList->VtxBuffer.Capacity;
    window->IDStack.clear();
    window->DrawList->_ClearFreeMemory();
    window->DC.ChildWindows.clear();
    window->DC.ItemWidthStack.clear();
    window->DC.TextWrapPosStack.clear();
}